

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarimatest2.c
# Opt level: O2

int main(void)

{
  double *amse;
  size_t __nmemb;
  double *inp;
  sarima_object obj;
  size_t sVar1;
  long lVar2;
  double dVar3;
  double *local_40;
  double *column;
  
  local_40 = (double *)0x0;
  column = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __nmemb = read_csv_column("../data/ohlc_min.csv","Close",&local_40);
  if (__nmemb != 0) {
    printf("Read %lu lines of \'%s\'\n",__nmemb,"../data/ohlc_min.csv");
    fflush(_stdout);
    inp = (double *)calloc(__nmemb,8);
    puts("Will take the logarithm");
    fflush(_stdout);
    for (sVar1 = 0; __nmemb != sVar1; sVar1 = sVar1 + 1) {
      dVar3 = log(local_40[sVar1]);
      inp[sVar1] = dVar3;
    }
    puts("Initializing SARIMA");
    fflush(_stdout);
    obj = sarima_init(0,1,1,0xc,0,0,1,(int)__nmemb);
    sarima_setMethod(obj,0);
    puts("Will exec SARIMA");
    fflush(_stdout);
    sarima_exec(obj,inp);
    sarima_summary(obj);
    printf("Will predict %d values",5);
    fflush(_stdout);
    sarima_predict(obj,inp,5,column,amse);
    putchar(10);
    printf("Predicted Values : ");
    for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
      printf("%g ",column[lVar2]);
    }
    putchar(10);
    printf("Standard Errors  : ");
    for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
      dVar3 = amse[lVar2];
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      printf("%g ",dVar3);
    }
    putchar(10);
    sarima_free(obj);
    free(local_40);
    free(inp);
    free(column);
    free(amse);
    return 0;
  }
  printf("Could not load data from file \'%s\'","../data/ohlc_min.csv");
  exit(100);
}

Assistant:

int main(void) {
	int i, N, d, L;
	double *inp;
	int p, q;
	int s, P, D, Q;
	double *xpred, *amse;
	double *column = (double*)NULL;
	size_t n_rows = 0;
	sarima_object obj;
	p = 0;
	d = 1;
	q = 1;
	s = 12;
	P = 0;
	D = 0; // OBS.: not enough data for seasonal differencing
	Q = 1;

	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	n_rows = read_csv_column(INPUT_FILE, "Close", &column);
	if (0 == n_rows) {
		printf("Could not load data from file '%s'", INPUT_FILE);
		exit(100);
	}

	printf("Read %lu lines of '%s'\n", n_rows, INPUT_FILE);
	fflush(stdout);

	inp = (double*)calloc(n_rows, sizeof(double));
	//wmean = mean(temp, N);

	puts("Will take the logarithm"); fflush(stdout);
	for (i = 0; i < n_rows; ++i) {
		inp[i] = log(column[i]);
		//printf("%g \n",inp[i]);
	}

	puts("Initializing SARIMA"); fflush(stdout);
	obj = sarima_init(p, d, q, s, P, D, Q, n_rows);
	sarima_setMethod(obj, 0); 
	/** \brief Method 0 ("MLE") is default so this step is unnecessary. 
	 * The method also accepts values 1 ("CSS") and 2 ("Box-Jenkins")
	 **/
	 
	// sarima_setOptMethod(obj, 7);
	/** \brief Method 7 ("BFGS with More Thuente Line Search") is 
	 * default so this step is unnecessary. The method also accepts 
	 * values 0,1,2,3,4,5,6. Check the documentation for details.
	 **/

	puts("Will exec SARIMA");  fflush(stdout);
	sarima_exec(obj, inp);
	sarima_summary(obj);
	
	// Predict the next 5 values using the obtained ARIMA model
	printf("Will predict %d values", L);  fflush(stdout);
	sarima_predict(obj, inp, L, xpred, amse);
	printf("\n");
	
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	
	sarima_free(obj);
	free(column);
	free(inp);
	free(xpred);
	free(amse);
	
	return 0;
}